

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignModelId_Test::~Annotator_assignModelId_Test(Annotator_assignModelId_Test *this)

{
  Annotator_assignModelId_Test *this_local;
  
  ~Annotator_assignModelId_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, assignModelId)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    annotator->setModel(model);

    EXPECT_EQ("", model->id());
    EXPECT_EQ("", model->encapsulationId());

    annotator->assignId(model);
    EXPECT_EQ("b4da55", model->id());
    annotator->assignId(model, libcellml::CellmlElementType::ENCAPSULATION);
    EXPECT_EQ("b4da56", model->encapsulationId());
}